

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O3

VisitResult * __thiscall
slang::analysis::ClockVisitor::visit
          (VisitResult *__return_storage_ptr__,ClockVisitor *this,SequenceConcatExpr *expr,
          Clock outerClock,bitmask<slang::analysis::VisitFlags> flags)

{
  uint uVar1;
  size_t sVar2;
  pointer pEVar3;
  bool bVar4;
  long lVar5;
  AssertionExpr *expr_00;
  Clock pTVar6;
  bool bVar7;
  byte bVar8;
  initializer_list<const_slang::ast::TimingControl_*> list;
  SourceRange opRange;
  VisitResult result;
  TimingControl *local_98;
  bitmask<slang::analysis::VisitFlags> local_84;
  VisitResult *local_80;
  long local_78;
  VisitResult local_70;
  Clock local_38;
  
  sVar2 = (expr->elements)._M_extent._M_extent_value;
  if (sVar2 != 0) {
    pEVar3 = (expr->elements)._M_ptr;
    local_78 = sVar2 * 0x28;
    lVar5 = 0;
    local_98 = (TimingControl *)0x0;
    pTVar6 = (Clock)0x0;
    expr_00 = (AssertionExpr *)0x0;
    bVar8 = 0;
    bVar7 = false;
    local_80 = __return_storage_ptr__;
    local_38 = outerClock;
    do {
      local_84.m_bits = flags.m_bits | 1;
      ast::AssertionExpr::
      visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::bitmask<slang::analysis::VisitFlags>>
                (&local_70,*(AssertionExpr **)((long)&(pEVar3->sequence).ptr + lVar5),this,&local_38
                 ,&local_84);
      if (local_70.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.len != 0) {
        pTVar6 = local_70.endClock;
        if (local_70.endClock == (Clock)0x0) {
          pTVar6 = local_70.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_
                   [local_70.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.len - 1
                   ];
        }
        if (local_98 == (TimingControl *)0x0) {
          local_98 = *local_70.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_
          ;
        }
        else {
          if (local_70.isMulticlockedSeq == false) {
            bVar4 = isSameClock(local_98,*local_70.clocks.
                                          super_SmallVectorBase<const_slang::ast::TimingControl_*>.
                                          data_);
            if (bVar4) goto LAB_003fe08e;
          }
          if ((bVar8 & 1) == 0) {
            requireOnlyNonEmptyMatch(this,expr_00);
          }
          if (local_70.isMulticlockedSeq == false) {
            requireOnlyNonEmptyMatch
                      (this,*(AssertionExpr **)((long)&(pEVar3->sequence).ptr + lVar5));
          }
          uVar1 = *(uint *)((long)&(pEVar3->delay).min + lVar5);
          if (((uVar1 < 2) &&
              (*(char *)((long)&(pEVar3->delay).max.super__Optional_base<unsigned_int,_true,_true>.
                                _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged +
                        lVar5) == '\x01')) &&
             (*(uint *)((long)&(pEVar3->delay).max.super__Optional_base<unsigned_int,_true,_true>.
                               _M_payload.super__Optional_payload_base<unsigned_int>._M_payload +
                       lVar5) == uVar1)) {
            bVar7 = true;
          }
          else {
            bVar7 = true;
            opRange.endLoc = *(SourceLocation *)(&(pEVar3->delayRange).endLoc.field_0x0 + lVar5);
            opRange.startLoc = *(SourceLocation *)(&(pEVar3->delayRange).startLoc.field_0x0 + lVar5)
            ;
            badMulticlockedSeq(this,*(AssertionExpr **)((long)&(pEVar3->sequence).ptr + lVar5),
                               expr_00,opRange);
          }
        }
      }
LAB_003fe08e:
      bVar8 = local_70.isMulticlockedSeq;
      expr_00 = *(AssertionExpr **)((long)&(pEVar3->sequence).ptr + lVar5);
      if (local_70.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_ !=
          (pointer)local_70.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.
                   firstElement) {
        operator_delete(local_70.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.
                        data_);
      }
      __return_storage_ptr__ = local_80;
      lVar5 = lVar5 + 0x28;
    } while (local_78 != lVar5);
    if (local_98 != (TimingControl *)0x0) {
      local_70.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_ =
           (pointer)local_98;
      list._M_len = 1;
      list._M_array = (iterator)&local_70;
      SmallVector<const_slang::ast::TimingControl_*,_2UL>::SmallVector(&local_80->clocks,list);
      goto LAB_003fe111;
    }
  }
  __return_storage_ptr__->endClock = (Clock)0x0;
  *(undefined8 *)&__return_storage_ptr__->isMulticlockedSeq = 0;
  (__return_storage_ptr__->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.
  firstElement[0] = '\0';
  (__return_storage_ptr__->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.
  firstElement[1] = '\0';
  (__return_storage_ptr__->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.
  firstElement[2] = '\0';
  (__return_storage_ptr__->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.
  firstElement[3] = '\0';
  (__return_storage_ptr__->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.
  firstElement[4] = '\0';
  (__return_storage_ptr__->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.
  firstElement[5] = '\0';
  (__return_storage_ptr__->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.
  firstElement[6] = '\0';
  (__return_storage_ptr__->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.
  firstElement[7] = '\0';
  (__return_storage_ptr__->clocks).stackBase[0] = '\0';
  (__return_storage_ptr__->clocks).stackBase[1] = '\0';
  (__return_storage_ptr__->clocks).stackBase[2] = '\0';
  (__return_storage_ptr__->clocks).stackBase[3] = '\0';
  (__return_storage_ptr__->clocks).stackBase[4] = '\0';
  (__return_storage_ptr__->clocks).stackBase[5] = '\0';
  (__return_storage_ptr__->clocks).stackBase[6] = '\0';
  (__return_storage_ptr__->clocks).stackBase[7] = '\0';
  (__return_storage_ptr__->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_ =
       (pointer)(__return_storage_ptr__->clocks).
                super_SmallVectorBase<const_slang::ast::TimingControl_*>.firstElement;
  (__return_storage_ptr__->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.len = 0;
  (__return_storage_ptr__->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.cap = 2;
  pTVar6 = (Clock)0x0;
  bVar7 = false;
LAB_003fe111:
  __return_storage_ptr__->endClock = pTVar6;
  __return_storage_ptr__->isMulticlockedSeq = bVar7;
  return __return_storage_ptr__;
}

Assistant:

VisitResult visit(const SequenceConcatExpr& expr, Clock outerClock, bitmask<VF> flags) {
        Clock firstClock = nullptr;
        Clock endClock = nullptr;
        const AssertionExpr* lastExpr = nullptr;
        bool lastWasMulticlocked = false;
        bool isMulticlockedSeq = false;

        for (auto& elem : expr.elements) {
            auto result = elem.sequence->visit(*this, outerClock, flags | VF::RequireSequence);
            if (!result.clocks.empty()) {
                endClock = result.endClock == nullptr ? result.clocks.back() : result.endClock;
                if (!firstClock) {
                    firstClock = result.clocks[0];
                }
                else if (result.isMulticlockedSeq || !isSameClock(*firstClock, *result.clocks[0])) {
                    // When concatenating differently clocked sequences, the maximal single-clocked
                    // subsequences must not admit an empty match.
                    if (!lastWasMulticlocked)
                        requireOnlyNonEmptyMatch(*lastExpr);
                    if (!result.isMulticlockedSeq)
                        requireOnlyNonEmptyMatch(*elem.sequence);

                    isMulticlockedSeq = true;
                    if (elem.delay.min > 1 || elem.delay.max != elem.delay.min)
                        badMulticlockedSeq(*elem.sequence, *lastExpr, elem.delayRange);
                }
            }
            lastExpr = elem.sequence;
            lastWasMulticlocked = result.isMulticlockedSeq;
        }

        if (!firstClock)
            return {};

        return {firstClock, isMulticlockedSeq, endClock};
    }